

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlainObjectBase.h
# Opt level: O0

void __thiscall
Eigen::PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::resize
          (PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *this,Index rows,Index cols)

{
  bool bVar1;
  Index cols_local;
  Index rows_local;
  PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *this_local;
  
  bVar1 = false;
  if ((rows == 4) && (bVar1 = false, cols == 4)) {
    bVar1 = true;
  }
  if (bVar1) {
    DenseStorage<double,_16,_4,_4,_0>::resize(&this->m_storage,rows * cols,rows,cols);
    return;
  }
  __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/MacWen[P]CMAES/include/../3rdParty/Eigen/src/Core/PlainObjectBase.h"
                ,0x11d,
                "void Eigen::PlainObjectBase<Eigen::Matrix<double, 4, 4>>::resize(Index, Index) [Derived = Eigen::Matrix<double, 4, 4>]"
               );
}

Assistant:

void resize(Index rows, Index cols)
    {
      eigen_assert(   EIGEN_IMPLIES(RowsAtCompileTime!=Dynamic,rows==RowsAtCompileTime)
                   && EIGEN_IMPLIES(ColsAtCompileTime!=Dynamic,cols==ColsAtCompileTime)
                   && EIGEN_IMPLIES(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic,rows<=MaxRowsAtCompileTime)
                   && EIGEN_IMPLIES(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic,cols<=MaxColsAtCompileTime)
                   && rows>=0 && cols>=0 && "Invalid sizes when resizing a matrix or array.");
      internal::check_rows_cols_for_overflow<MaxSizeAtCompileTime>::run(rows, cols);
      #ifdef EIGEN_INITIALIZE_COEFFS
        Index size = rows*cols;
        bool size_changed = size != this->size();
        m_storage.resize(size, rows, cols);
        if(size_changed) EIGEN_INITIALIZE_COEFFS_IF_THAT_OPTION_IS_ENABLED
      #else
        m_storage.resize(rows*cols, rows, cols);
      #endif
    }